

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O3

bool __thiscall
aeron::archive::ArchiveProxy::stopRecording
          (ArchiveProxy *this,int64_t subscriptionId,int64_t correlationId,int64_t controlSessionId)

{
  bool bVar1;
  StopRecordingSubscriptionRequest *pSVar2;
  int64_t val;
  int64_t val_1;
  int64_t val_2;
  StopRecordingSubscriptionRequest msg;
  StopRecordingSubscriptionRequest local_68;
  
  local_68.m_offset = 0;
  local_68.m_buffer = (char *)0x0;
  local_68.m_bufferLength = 0;
  pSVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::StopRecordingSubscriptionRequest>
                     (this,&local_68);
  *(int64_t *)(pSVar2->m_buffer + pSVar2->m_offset) = controlSessionId;
  *(int64_t *)(pSVar2->m_buffer + pSVar2->m_offset + 8) = correlationId;
  *(int64_t *)(pSVar2->m_buffer + pSVar2->m_offset + 0x10) = subscriptionId;
  bVar1 = offer(this,(int)local_68.m_position - (int)local_68.m_offset);
  return bVar1;
}

Assistant:

bool ArchiveProxy::stopRecording(std::int64_t subscriptionId, std::int64_t correlationId,
                                 std::int64_t controlSessionId) {
    codecs::StopRecordingSubscriptionRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .subscriptionId(subscriptionId);

    return offer(msg.encodedLength());
}